

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O2

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  uint _c;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  uint _w;
  uint _d;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  void *pvVar29;
  ulong uVar30;
  void *pvVar31;
  int i_1;
  int iVar32;
  int iVar33;
  int iw_1;
  int iVar34;
  int iVar35;
  ulong uVar36;
  int j;
  int iVar37;
  long lVar38;
  int iVar39;
  int l;
  int iVar40;
  ulong uVar41;
  int i_2;
  int iVar42;
  int iVar43;
  ulong uVar44;
  float fVar45;
  void *local_1e8;
  void *local_1d8;
  void *local_1c8;
  void *local_1c0;
  void *local_188;
  allocator_type local_171;
  void *local_170;
  void *local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  int local_140;
  undefined4 uStack_13c;
  int local_138;
  undefined4 uStack_134;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  Mat local_108;
  void *local_b8;
  long local_b0;
  void *local_a8;
  long local_a0;
  ulong local_98;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  
  uVar3 = bottom_blob->w;
  iVar27 = bottom_blob->h;
  uVar26 = bottom_blob->d;
  _c = bottom_blob->c;
  uVar13 = (ulong)_c;
  sVar4 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_108.cstep = 0;
      local_108.data = (void *)0x0;
      local_108.refcount._0_4_ = 0;
      local_108.refcount._4_4_ = 0;
      local_108.elemsize._0_4_ = 0;
      local_108.elemsize._4_4_ = 0;
      local_108.elempack = 0;
      local_108.allocator = (Allocator *)0x0;
      local_108.dims = 0;
      local_108.w = 0;
      local_108.h = 0;
      local_108.d = 0;
      local_108.c = 0;
      opt_pad.lightmode = opt->lightmode;
      opt_pad.use_shader_pack8 = opt->use_shader_pack8;
      opt_pad.use_subgroup_ops = opt->use_subgroup_ops;
      opt_pad.use_reserved_0 = opt->use_reserved_0;
      opt_pad.num_threads = opt->num_threads;
      opt_pad.blob_allocator = opt->blob_allocator;
      opt_pad.workspace_allocator = opt->workspace_allocator;
      opt_pad.openmp_blocktime = opt->openmp_blocktime;
      opt_pad.use_winograd_convolution = opt->use_winograd_convolution;
      opt_pad.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_pad.use_int8_inference = opt->use_int8_inference;
      opt_pad.use_vulkan_compute = opt->use_vulkan_compute;
      uVar24._0_1_ = opt->use_bf16_storage;
      uVar24._1_1_ = opt->use_fp16_packed;
      uVar24._2_1_ = opt->use_fp16_storage;
      uVar24._3_1_ = opt->use_fp16_arithmetic;
      uVar24._4_1_ = opt->use_int8_packed;
      uVar24._5_1_ = opt->use_int8_storage;
      uVar24._6_1_ = opt->use_int8_arithmetic;
      uVar24._7_1_ = opt->use_packing_layout;
      opt_pad.vulkan_device_index = opt->vulkan_device_index;
      opt_pad.use_reserved_1 = opt->use_reserved_1;
      opt_pad.use_image_storage = opt->use_image_storage;
      opt_pad.use_tensor_storage = opt->use_tensor_storage;
      opt_pad.use_reserved_2 = opt->use_reserved_2;
      opt_pad.flush_denormals = opt->flush_denormals;
      opt_pad.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_pad.use_shader_local_memory = opt->use_shader_local_memory;
      opt_pad.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_pad.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_pad.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_pad.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_pad.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_pad.use_fp16_uniform = opt->use_fp16_uniform;
      opt_pad.use_int8_uniform = opt->use_int8_uniform;
      opt_pad.use_reserved_9 = opt->use_reserved_9;
      opt_pad.use_reserved_10 = opt->use_reserved_10;
      opt_pad.use_reserved_11 = opt->use_reserved_11;
      opt_pad._32_8_ = uVar24 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_108,&opt_pad);
      iVar43 = local_108.h;
      iVar42 = local_108.w;
      iVar27 = -100;
      if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
        iVar10 = local_108.d;
        iVar37 = (local_108.w - this->kernel_w) / this->stride_w;
        iVar15 = (local_108.h - this->kernel_h) / this->stride_h;
        iVar33 = iVar37 + 1;
        iVar32 = (local_108.d - this->kernel_d) / this->stride_d;
        Mat::create(top_blob,iVar33,iVar15 + 1,iVar32 + 1,_c,sVar4,(Allocator *)0x0);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar24 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar24,&local_171);
          iVar27 = this->kernel_w;
          iVar34 = this->kernel_h;
          iVar11 = iVar43 - iVar34;
          iVar21 = iVar42 - iVar27;
          iVar39 = 0;
          iVar12 = 0;
          for (iVar35 = 0; iVar35 < this->kernel_d; iVar35 = iVar35 + 1) {
            for (iVar40 = 0; iVar40 < iVar34; iVar40 = iVar40 + 1) {
              for (lVar22 = 0; iVar34 = (int)lVar22, iVar34 < iVar27; lVar22 = lVar22 + 1) {
                _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar39 + lVar22] = iVar12 + iVar34;
                iVar27 = this->kernel_w;
              }
              iVar39 = iVar39 + iVar34;
              iVar12 = iVar12 + iVar21 + iVar34;
              iVar34 = this->kernel_h;
            }
            iVar12 = iVar12 + iVar11 * iVar42;
          }
          lVar22 = (long)iVar33;
          lVar18 = (long)iVar37;
          iVar27 = (int)uVar24;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar33 = 0;
              iVar27 = 0;
              iVar37 = 0;
              if (this->pad_mode == 0) {
                iVar33 = (bottom_blob->w - local_108.w) + this->pad_left + this->pad_right;
                iVar27 = (bottom_blob->h - local_108.h) + this->pad_top + this->pad_bottom;
                iVar37 = (bottom_blob->d - local_108.d) + this->pad_front + this->pad_behind;
              }
              local_b8 = local_108.data;
              local_a0 = top_blob->cstep * top_blob->elemsize;
              local_a8 = top_blob->data;
              local_150 = (long)iVar15;
              local_160 = (long)iVar32;
              if ((int)_c < 1) {
                uVar13 = 0;
              }
              local_b0 = local_108.cstep *
                         CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              lVar14 = (long)local_108.w *
                       CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              _local_138 = CONCAT44(uStack_134,iVar33 + iVar42);
              _local_140 = CONCAT44(uStack_13c,iVar37 + iVar10);
              uVar24 = 0;
              while (uVar28 = uVar24, uVar28 != uVar13) {
                local_188 = (void *)(local_a0 * uVar28 + (long)local_a8);
                local_110 = (long)this->stride_d;
                local_118 = local_108.h * lVar14 * local_110;
                local_170 = local_b8;
                lVar38 = 0;
                while (lVar19 = lVar38, lVar19 <= local_160) {
                  iVar15 = this->stride_h;
                  pvVar31 = local_170;
                  lVar38 = 0;
                  while (lVar23 = lVar38, pvVar17 = pvVar31, lVar23 <= local_150) {
                    local_128 = (long)this->stride_w;
                    uVar24 = (ulong)(uint)this->kernel_d;
                    if (this->kernel_d < 1) {
                      uVar24 = 0;
                    }
                    local_130 = local_128 * 4;
                    lVar25 = 0;
                    lVar38 = 0;
                    local_1e8 = pvVar17;
                    while (lVar20 = lVar38, lVar20 <= lVar18) {
                      uVar41 = 0;
                      uVar30 = (ulong)(uint)this->kernel_w;
                      if (this->kernel_w < 1) {
                        uVar30 = uVar41;
                      }
                      uVar3 = this->kernel_h;
                      if (this->kernel_h < 1) {
                        uVar3 = 0;
                      }
                      fVar45 = 0.0;
                      local_1d8 = local_1e8;
                      iVar32 = 0;
                      for (; uVar41 != uVar24; uVar41 = uVar41 + 1) {
                        lVar38 = lVar19 * local_110 + uVar41;
                        if (this->pad_front <= lVar38) {
                          if ((iVar37 + iVar10) - this->pad_behind <= lVar38) break;
                          pvVar31 = local_1d8;
                          for (uVar44 = 0; uVar44 != uVar3; uVar44 = uVar44 + 1) {
                            lVar38 = uVar44 + lVar23 * iVar15;
                            if (this->pad_top <= lVar38) {
                              if ((iVar27 + iVar43) - this->pad_bottom <= lVar38) break;
                              for (uVar36 = 0; uVar30 != uVar36; uVar36 = uVar36 + 1) {
                                if ((long)this->pad_left <= (long)(uVar36 + lVar25)) {
                                  if ((long)((iVar33 + iVar42) - this->pad_right) <=
                                      (long)(uVar36 + lVar25)) break;
                                  fVar45 = fVar45 + *(float *)((long)pvVar31 + uVar36 * 4);
                                  iVar32 = iVar32 + 1;
                                }
                              }
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar14);
                          }
                        }
                        local_1d8 = (void *)((long)local_1d8 + local_108.h * lVar14);
                      }
                      *(float *)((long)local_188 + lVar20 * 4) = fVar45 / (float)iVar32;
                      local_1e8 = (void *)((long)local_1e8 + local_130);
                      lVar25 = lVar25 + local_128;
                      local_120 = lVar20;
                      lVar38 = lVar20 + 1;
                    }
                    local_188 = (void *)((long)local_188 + lVar22 * 4);
                    pvVar31 = (void *)((long)pvVar17 + lVar14 * iVar15);
                    local_168 = pvVar17;
                    local_148 = lVar23;
                    lVar38 = lVar23 + 1;
                  }
                  local_170 = (void *)((long)local_170 + local_118);
                  local_158 = lVar19;
                  lVar38 = lVar19 + 1;
                }
                local_b8 = (void *)((long)local_b8 + local_b0);
                local_98 = uVar28;
                uVar24 = uVar28 + 1;
              }
            }
            else {
              pvVar31 = top_blob->data;
              sVar4 = top_blob->cstep;
              sVar5 = top_blob->elemsize;
              lVar14 = (long)local_108.w *
                       CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              uVar28 = 0;
              uVar24 = uVar24 & 0xffffffff;
              if (iVar27 < 1) {
                uVar24 = uVar28;
              }
              if ((int)_c < 1) {
                uVar13 = uVar28;
              }
              for (; uVar28 != uVar13; uVar28 = uVar28 + 1) {
                pvVar17 = (void *)(sVar4 * sVar5 * uVar28 + (long)pvVar31);
                for (iVar42 = 0; iVar42 <= iVar32; iVar42 = iVar42 + 1) {
                  for (iVar43 = 0; iVar43 <= iVar15; iVar43 = iVar43 + 1) {
                    iVar37 = this->stride_d;
                    iVar10 = this->stride_h;
                    iVar33 = this->stride_w;
                    for (lVar38 = 0; lVar38 <= lVar18; lVar38 = lVar38 + 1) {
                      fVar45 = 0.0;
                      for (uVar30 = 0; uVar24 != uVar30; uVar30 = uVar30 + 1) {
                        fVar45 = fVar45 + *(float *)((long)local_108.data +
                                                    (long)_space_ofs.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar30] *
                                                  4 + lVar38 * iVar33 * 4 +
                                                      (long)iVar43 * (long)iVar10 * lVar14 +
                                                      (long)iVar37 * (long)iVar42 *
                                                      local_108.h * lVar14 +
                                                      local_108.cstep *
                                                      CONCAT44(local_108.elemsize._4_4_,
                                                               (undefined4)local_108.elemsize) *
                                                      uVar28);
                      }
                      *(float *)((long)pvVar17 + lVar38 * 4) = fVar45 * (1.0 / (float)iVar27);
                    }
                    pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                  }
                }
              }
            }
          }
          else if (this->pooling_type == 0) {
            sVar4 = top_blob->cstep;
            sVar5 = top_blob->elemsize;
            lVar14 = (long)local_108.w *
                     CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            uVar28 = 0;
            uVar24 = uVar24 & 0xffffffff;
            if (iVar27 < 1) {
              uVar24 = uVar28;
            }
            pvVar31 = top_blob->data;
            if ((int)_c < 1) {
              uVar13 = uVar28;
            }
            for (; uVar28 != uVar13; uVar28 = uVar28 + 1) {
              pvVar17 = (void *)(sVar4 * sVar5 * uVar28 + (long)pvVar31);
              for (iVar27 = 0; iVar27 <= iVar32; iVar27 = iVar27 + 1) {
                for (iVar42 = 0; iVar42 <= iVar15; iVar42 = iVar42 + 1) {
                  iVar43 = this->stride_d;
                  iVar37 = this->stride_h;
                  iVar10 = this->stride_w;
                  for (lVar38 = 0; lVar38 <= lVar18; lVar38 = lVar38 + 1) {
                    pfVar1 = (float *)((long)local_108.data +
                                      lVar38 * iVar10 * 4 +
                                      (long)iVar42 * (long)iVar37 * lVar14 +
                                      (long)iVar43 * (long)iVar27 * local_108.h * lVar14 +
                                      local_108.cstep *
                                      CONCAT44(local_108.elemsize._4_4_,
                                               (undefined4)local_108.elemsize) * uVar28);
                    fVar45 = *pfVar1;
                    for (uVar30 = 0; uVar24 != uVar30; uVar30 = uVar30 + 1) {
                      fVar2 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar30]];
                      if (fVar45 <= fVar2) {
                        fVar45 = fVar2;
                      }
                    }
                    *(float *)((long)pvVar17 + lVar38 * 4) = fVar45;
                  }
                  pvVar17 = (void *)((long)pvVar17 + lVar22 * 4);
                }
              }
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
          iVar27 = 0;
        }
      }
      piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar6 == (int *)0x0) {
        return iVar27;
      }
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 != 0) {
        return iVar27;
      }
      if (local_108.allocator != (Allocator *)0x0) {
        (*(local_108.allocator)->_vptr_Allocator[3])();
        return iVar27;
      }
      free(local_108.data);
      return iVar27;
    }
    _w = this->out_w;
    if (this->out_w == 0xffffff17) {
      _w = uVar3;
    }
    iVar42 = this->out_h;
    if (this->out_h == -0xe9) {
      iVar42 = iVar27;
    }
    _d = this->out_d;
    if (this->out_d == 0xffffff17) {
      _d = uVar26;
    }
    local_168 = (void *)(ulong)_d;
    if (_d == uVar26 && (iVar42 == iVar27 && _w == uVar3)) {
      if (top_blob != bottom_blob) {
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->c = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        piVar6 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar6;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar27 = bottom_blob->w;
        iVar42 = bottom_blob->h;
        iVar43 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar27;
        top_blob->h = iVar42;
        top_blob->d = iVar43;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
        return 0;
      }
    }
    else {
      Mat::create(top_blob,_w,iVar42,_d,_c,sVar4,opt->blob_allocator);
      pvVar31 = top_blob->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar4 = top_blob->cstep;
      if ((long)top_blob->c * sVar4 == 0) {
        return -100;
      }
      iVar43 = (int)local_168;
      if (this->pooling_type == 0) {
        sVar5 = bottom_blob->cstep;
        sVar7 = bottom_blob->elemsize;
        sVar8 = top_blob->elemsize;
        pvVar17 = bottom_blob->data;
        uVar24 = 0;
        if (0 < (int)_w) {
          uVar24 = (ulong)_w;
        }
        iVar37 = iVar42;
        if (iVar42 < 1) {
          iVar37 = 0;
        }
        iVar15 = iVar43;
        if (iVar43 < 1) {
          iVar15 = 0;
        }
        if ((int)_c < 1) {
          uVar13 = 0;
        }
        for (uVar28 = 0; uVar28 != uVar13; uVar28 = uVar28 + 1) {
          lVar22 = sVar5 * sVar7 * uVar28;
          local_1c0 = (void *)(sVar4 * sVar8 * uVar28 + (long)pvVar31);
          iVar32 = 0;
          while (iVar32 != iVar15) {
            iVar33 = (int)(iVar32 * uVar26) / iVar43;
            iVar32 = iVar32 + 1;
            iVar10 = 0;
            while (iVar10 != iVar37) {
              uVar30 = (long)(iVar10 * iVar27) / (long)iVar42;
              iVar10 = iVar10 + 1;
              uVar41 = 0;
              while (uVar41 != uVar24) {
                iVar34 = (int)(uVar3 * (int)uVar41) / (int)_w;
                iVar21 = iVar34 + ((int)uVar30 + iVar33 * iVar27) * uVar3;
                fVar45 = *(float *)((long)pvVar17 + (long)iVar21 * 4 + lVar22);
                for (iVar11 = iVar33; iVar11 < (int)(iVar32 * uVar26 + iVar43 + -1) / iVar43;
                    iVar11 = iVar11 + 1) {
                  iVar39 = iVar21;
                  for (uVar44 = uVar30 & 0xffffffff; lVar18 = (long)iVar34, iVar12 = iVar39,
                      (int)uVar44 < (iVar10 * iVar27 + iVar42 + -1) / iVar42;
                      uVar44 = (ulong)((int)uVar44 + 1)) {
                    for (; lVar18 < (int)((int)(uVar41 + 1) * uVar3 + (_w - 1)) / (int)_w;
                        lVar18 = lVar18 + 1) {
                      fVar2 = *(float *)((long)pvVar17 + (long)iVar12 * 4 + lVar22);
                      if (fVar45 <= fVar2) {
                        fVar45 = fVar2;
                      }
                      iVar12 = iVar12 + 1;
                    }
                    iVar39 = iVar39 + uVar3;
                  }
                  iVar21 = iVar21 + iVar27 * uVar3;
                }
                *(float *)((long)local_1c0 + uVar41 * 4) = fVar45;
                uVar41 = uVar41 + 1;
              }
              local_1c0 = (void *)((long)local_1c0 + (long)(int)_w * 4);
            }
          }
        }
        return 0;
      }
      if (this->pooling_type == 1) {
        sVar5 = bottom_blob->cstep;
        sVar7 = bottom_blob->elemsize;
        sVar8 = top_blob->elemsize;
        pvVar17 = bottom_blob->data;
        uVar24 = 0;
        if (0 < (int)_w) {
          uVar24 = (ulong)_w;
        }
        iVar37 = iVar42;
        if (iVar42 < 1) {
          iVar37 = 0;
        }
        iVar15 = iVar43;
        if (iVar43 < 1) {
          iVar15 = 0;
        }
        if ((int)_c < 1) {
          uVar13 = 0;
        }
        for (uVar28 = 0; uVar28 != uVar13; uVar28 = uVar28 + 1) {
          local_1c8 = (void *)(sVar4 * sVar8 * uVar28 + (long)pvVar31);
          iVar32 = 0;
          while (iVar32 != iVar15) {
            iVar34 = (int)(iVar32 * uVar26) / iVar43;
            iVar32 = iVar32 + 1;
            iVar10 = (int)(iVar32 * uVar26 + iVar43 + -1) / iVar43;
            iVar33 = 0;
            while (iVar33 != iVar37) {
              uVar30 = (long)(iVar33 * iVar27) / (long)iVar42;
              iVar33 = iVar33 + 1;
              iVar11 = (iVar33 * iVar27 + iVar42 + -1) / iVar42;
              iVar21 = (int)uVar30;
              uVar41 = 0;
              while (uVar41 != uVar24) {
                iVar35 = (int)(uVar3 * (int)uVar41) / (int)_w;
                iVar12 = (int)((int)(uVar41 + 1) * uVar3 + (_w - 1)) / (int)_w;
                iVar40 = (iVar21 + iVar34 * iVar27) * uVar3 + iVar35;
                fVar45 = 0.0;
                for (iVar39 = iVar34; iVar39 < iVar10; iVar39 = iVar39 + 1) {
                  iVar16 = iVar40;
                  for (uVar44 = uVar30 & 0xffffffff; lVar22 = (long)iVar35, iVar9 = iVar16,
                      (int)uVar44 < iVar11; uVar44 = (ulong)((int)uVar44 + 1)) {
                    for (; lVar22 < iVar12; lVar22 = lVar22 + 1) {
                      fVar45 = fVar45 + *(float *)((long)pvVar17 +
                                                  (long)iVar9 * 4 + sVar5 * sVar7 * uVar28);
                      iVar9 = iVar9 + 1;
                    }
                    iVar16 = iVar16 + uVar3;
                  }
                  iVar40 = iVar40 + iVar27 * uVar3;
                }
                *(float *)((long)local_1c8 + uVar41 * 4) =
                     fVar45 / ((float)(iVar12 - iVar35) *
                              (float)(iVar11 - iVar21) * (float)(iVar10 - iVar34));
                uVar41 = uVar41 + 1;
              }
              local_1c8 = (void *)((long)local_1c8 + (long)(int)_w * 4);
            }
          }
        }
        return 0;
      }
    }
  }
  else {
    Mat::create(top_blob,_c,sVar4,opt->blob_allocator);
    pvVar31 = top_blob->data;
    if (pvVar31 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar26 = iVar27 * uVar3 * uVar26;
    if (this->pooling_type == 0) {
      pvVar17 = bottom_blob->data;
      lVar22 = bottom_blob->cstep * bottom_blob->elemsize;
      uVar24 = (ulong)uVar26;
      if ((int)uVar26 < 1) {
        uVar24 = 0;
      }
      if ((int)_c < 1) {
        uVar13 = 0;
      }
      pvVar29 = pvVar17;
      for (uVar28 = 0; uVar28 != uVar13; uVar28 = uVar28 + 1) {
        fVar45 = *(float *)((long)pvVar17 + lVar22 * uVar28);
        for (uVar30 = 0; uVar24 != uVar30; uVar30 = uVar30 + 1) {
          fVar2 = *(float *)((long)pvVar29 + uVar30 * 4);
          if (fVar45 <= fVar2) {
            fVar45 = fVar2;
          }
        }
        *(float *)((long)pvVar31 + uVar28 * 4) = fVar45;
        pvVar29 = (void *)((long)pvVar29 + lVar22);
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      pvVar17 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      uVar24 = (ulong)uVar26;
      if ((int)uVar26 < 1) {
        uVar24 = 0;
      }
      if ((int)_c < 1) {
        uVar13 = 0;
      }
      sVar5 = bottom_blob->elemsize;
      for (uVar28 = 0; uVar28 != uVar13; uVar28 = uVar28 + 1) {
        fVar45 = 0.0;
        for (uVar30 = 0; uVar24 != uVar30; uVar30 = uVar30 + 1) {
          fVar45 = fVar45 + *(float *)((long)pvVar17 + uVar30 * 4);
        }
        *(float *)((long)pvVar31 + uVar28 * 4) = fVar45 * (1.0 / (float)(int)uVar26);
        pvVar17 = (void *)((long)pvVar17 + sVar4 * sVar5);
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;
        int _out_d = out_d == -233 ? d : out_d;

        if (_out_w == w && _out_h == h && _out_d == d)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, _out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}